

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_q4_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  byte *pbVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  int l;
  size_t sVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined1 *puVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  uint8_t *puVar18;
  byte bVar19;
  byte bVar20;
  int l_1;
  long lVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  uint uVar28;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint uVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  float fVar37;
  short sVar38;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int64_t nb;
  uint8_t Lm [8];
  uint8_t Ls [8];
  float scales [8];
  float mins [8];
  float sw [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  int in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd38;
  long local_2b8;
  long local_2b0;
  byte local_248 [8];
  byte local_240 [8];
  float local_238 [8];
  float local_218 [8];
  float local_1f8 [8];
  uint8_t local_1d8 [32];
  float local_1b8 [32];
  uint8_t local_138 [32];
  undefined1 local_118 [232];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar39;
  undefined6 uVar40;
  
  sVar10 = ggml_row_size(GGML_TYPE_Q4_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q4_K_ref(src,(block_q4_K *)dst,n_per_row * nrow);
  }
  else if (0 < nrow) {
    lVar11 = n_per_row + 0xff;
    if (-1 < n_per_row) {
      lVar11 = n_per_row;
    }
    local_2b8 = (long)dst + 8;
    local_2b0 = 0;
    do {
      if (0xff < n_per_row) {
        lVar22 = 0;
        pfVar16 = quant_weights;
        pfVar17 = src;
        lVar23 = local_2b8;
        do {
          fVar32 = 0.0;
          lVar12 = 0;
          do {
            fVar32 = fVar32 + pfVar17[lVar12] * pfVar17[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x100);
          fVar32 = (fVar32 + fVar32) * 0.00390625;
          if (fVar32 < 0.0) {
            sqrtf(fVar32);
          }
          lVar12 = 0;
          pfVar15 = pfVar17;
          pfVar24 = pfVar16;
          do {
            lVar21 = 0;
            do {
              fVar27 = pfVar24[lVar21];
              fVar26 = pfVar15[lVar21] * pfVar15[lVar21] + fVar32;
              if (fVar26 < 0.0) {
                fVar26 = sqrtf(fVar26);
              }
              else {
                fVar26 = SQRT(fVar26);
              }
              local_1b8[lVar21] = fVar27 * fVar26;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x20);
            fVar27 = 0.0;
            lVar21 = 0;
            do {
              fVar27 = fVar27 + local_1b8[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x20);
            local_1f8[lVar12] = fVar27;
            fVar27 = make_qkx3_quants(0x20,0xf,pfVar17 + lVar12 * 0x20,local_1b8,
                                      local_138 + lVar12 * 0x20,local_1f8 + lVar12 + -8,local_1d8,
                                      fVar27,fVar32,in_stack_fffffffffffffd30,
                                      (_Bool)in_stack_fffffffffffffd38);
            local_238[lVar12] = fVar27;
            lVar12 = lVar12 + 1;
            pfVar15 = pfVar15 + 0x20;
            pfVar24 = pfVar24 + 0x20;
          } while (lVar12 != 8);
          fVar32 = make_qp_quants(8,0x3f,local_238,local_240,local_1f8);
          fVar27 = make_qp_quants(8,0x3f,local_218,local_248,local_1f8);
          auVar9 = _DAT_0014e7c0;
          auVar30 = _DAT_0014e710;
          uVar13 = 0;
          do {
            bVar19 = local_240[uVar13];
            bVar20 = local_248[uVar13];
            if (uVar13 < 4) {
              *(byte *)(lVar23 + -4 + uVar13) = bVar19;
              *(byte *)(lVar23 + uVar13) = bVar20;
            }
            else {
              *(byte *)(lVar23 + uVar13) = bVar20 << 4 | bVar19 & 0xf;
              pbVar1 = (byte *)(lVar23 + -8 + uVar13);
              *pbVar1 = *pbVar1 | (bVar19 & 0x30) << 2;
              pbVar1 = (byte *)(lVar23 + -4 + uVar13);
              *pbVar1 = *pbVar1 | (bVar20 & 0x30) << 2;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 8);
          uVar28 = (int)fVar32 * 2 ^ 0x80000000;
          uVar31 = (int)fVar27 * 2 ^ 0x80000000;
          uVar35 = -(uint)(-0xf000001 < (int)uVar28);
          uVar36 = -(uint)(-0xf000001 < (int)uVar31);
          fVar26 = (float)(~uVar35 & 0x40000000 | ((uint)fVar32 & 0x7f800000) + 0x7800000 & uVar35)
                   + ABS(fVar32) * 5.192297e+33 * 7.70372e-34;
          fVar37 = (float)(~uVar36 & 0x40000000 | ((uint)fVar27 & 0x7f800000) + 0x7800000 & uVar36)
                   + ABS(fVar27) * 5.192297e+33 * 7.70372e-34;
          auVar42._0_4_ = ((uint)fVar26 & 0xfff) + ((uint)fVar26 >> 0xd & 0x7c00);
          auVar42._4_4_ = ((uint)fVar37 & 0xfff) + ((uint)fVar37 >> 0xd & 0x7c00);
          auVar42._8_8_ = 0;
          auVar33._0_4_ = -(uint)(0x7f000000 < (int)uVar28);
          auVar33._4_4_ = -(uint)(0x7f000000 < (int)uVar31);
          auVar33._8_4_ = -(uint)(0 < (int)(extraout_XMM0_Db * 2 ^ 0x80000000));
          auVar33._12_4_ = -(uint)(0 < (int)(extraout_XMM0_Db_00 * 2 ^ 0x80000000));
          auVar29._0_4_ = (uint)fVar32 >> 0x10;
          auVar29._4_4_ = (uint)fVar27 >> 0x10;
          auVar29._8_4_ = extraout_XMM0_Db >> 0x10;
          auVar29._12_4_ = extraout_XMM0_Db_00 >> 0x10;
          lVar12 = lVar22 * 0x90;
          auVar29 = auVar33 & _DAT_0014e660 | auVar29 & _DAT_0014e640 | ~auVar33 & auVar42;
          auVar33 = pshuflw(~auVar33 & auVar42,auVar29,0xe8);
          *(int *)((long)dst + lVar12) = auVar33._0_4_;
          auVar33 = _DAT_0014e5b0;
          fVar32 = ggml_table_f32_f16[auVar29._0_4_];
          puVar18 = local_138;
          uVar13 = 0;
          pfVar15 = pfVar17;
          do {
            if (uVar13 < 4) {
              bVar20 = *(byte *)((long)dst + uVar13 + lVar12 + 4) & 0x3f;
              bVar19 = *(byte *)((long)dst + uVar13 + lVar12 + 8) & 0x3f;
            }
            else {
              bVar19 = *(byte *)((long)dst + uVar13 + lVar12 + 8);
              bVar20 = *(byte *)((long)dst + uVar13 + lVar12) >> 2 & 0x30 | bVar19 & 0xf;
              bVar19 = *(byte *)((long)dst + uVar13 + lVar12 + 4) >> 2 & 0x30 | bVar19 >> 4;
            }
            auVar34._0_4_ = (float)bVar20 * fVar32;
            if ((auVar34._0_4_ != 0.0) || (NAN(auVar34._0_4_))) {
              fVar27 = (float)bVar19 * ggml_table_f32_f16[auVar29._4_4_];
              auVar34._4_4_ = auVar34._0_4_;
              auVar34._8_4_ = auVar34._0_4_;
              auVar34._12_4_ = auVar34._0_4_;
              lVar21 = 0;
              do {
                pfVar24 = pfVar15 + lVar21;
                auVar41._0_4_ = *pfVar24 + fVar27;
                auVar41._4_4_ = pfVar24[1] + fVar27;
                auVar41._8_4_ = pfVar24[2] + fVar27;
                auVar41._12_4_ = pfVar24[3] + fVar27;
                auVar42 = divps(auVar41,auVar34);
                fVar26 = auVar42._0_4_ + 12582912.0;
                fVar37 = auVar42._4_4_ + 12582912.0;
                auVar43._0_8_ = CONCAT44(fVar37,fVar26) & 0x7fffff007fffff;
                auVar43._8_4_ = (uint)(auVar42._8_4_ + 12582912.0) & 0x7fffff;
                auVar43._12_4_ = (uint)(auVar42._12_4_ + 12582912.0) & 0x7fffff;
                auVar45._0_4_ = -(uint)((int)((uint)fVar26 & 0x7fffff) < auVar9._0_4_);
                auVar45._4_4_ = -(uint)((int)((uint)fVar37 & 0x7fffff) < auVar9._4_4_);
                auVar45._8_4_ = -(uint)((int)auVar43._8_4_ < auVar9._8_4_);
                auVar45._12_4_ = -(uint)((int)auVar43._12_4_ < auVar9._12_4_);
                auVar42 = ~auVar45 & auVar9 | auVar43 & auVar45;
                auVar44._0_4_ = -(uint)(0x400000 < auVar42._0_4_);
                auVar44._4_4_ = -(uint)(0x400000 < auVar42._4_4_);
                auVar44._8_4_ = -(uint)(0x400000 < auVar42._8_4_);
                auVar44._12_4_ = -(uint)(0x400000 < auVar42._12_4_);
                auVar42 = auVar44 & auVar42 & auVar30;
                sVar6 = auVar42._0_2_;
                cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar42[0] - (0xff < sVar6);
                sVar6 = auVar42._2_2_;
                sVar38 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar42[2] - (0xff < sVar6),cVar2)
                ;
                sVar6 = auVar42._4_2_;
                cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar42[4] - (0xff < sVar6);
                sVar6 = auVar42._6_2_;
                uVar39 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar42[6] - (0xff < sVar6),
                                  CONCAT12(cVar3,sVar38));
                sVar6 = auVar42._8_2_;
                cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar42[8] - (0xff < sVar6);
                sVar6 = auVar42._10_2_;
                uVar40 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar42[10] - (0xff < sVar6),
                                  CONCAT14(cVar4,uVar39));
                sVar6 = auVar42._12_2_;
                cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar42[0xc] - (0xff < sVar6);
                sVar8 = auVar42._14_2_;
                sVar6 = (short)((uint)uVar39 >> 0x10);
                sVar7 = (short)((uint6)uVar40 >> 0x20);
                sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar42[0xe] -
                                         (0xff < sVar8),CONCAT16(cVar5,uVar40)) >> 0x30);
                *(uint *)(puVar18 + lVar21) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                (0xff < sVar6),
                                                (0 < sVar38) * (sVar38 < 0x100) * cVar2 -
                                                (0xff < sVar38))));
                lVar21 = lVar21 + 4;
              } while (lVar21 != 0x20);
            }
            uVar13 = uVar13 + 1;
            puVar18 = puVar18 + 0x20;
            pfVar15 = pfVar15 + 0x20;
          } while (uVar13 != 8);
          lVar12 = (long)dst + lVar12 + 0x10;
          puVar14 = local_118;
          uVar13 = 0;
          do {
            lVar21 = 0;
            do {
              auVar30 = psllw(*(undefined1 (*) [16])(puVar14 + lVar21),4);
              *(undefined1 (*) [16])(lVar12 + lVar21) =
                   auVar30 & auVar33 | *(undefined1 (*) [16])(puVar14 + lVar21 + -0x20);
              lVar21 = lVar21 + 0x10;
            } while (lVar21 != 0x20);
            lVar12 = lVar12 + 0x20;
            puVar14 = puVar14 + 0x40;
            bVar25 = uVar13 < 0xc0;
            uVar13 = uVar13 + 0x40;
          } while (bVar25);
          pfVar17 = pfVar17 + 0x100;
          lVar22 = lVar22 + 1;
          pfVar16 = pfVar16 + 0x100;
          lVar23 = lVar23 + 0x90;
        } while (lVar22 != lVar11 >> 8);
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar10);
      local_2b0 = local_2b0 + 1;
      local_2b8 = local_2b8 + sVar10;
    } while (local_2b0 != nrow);
  }
  return sVar10 * nrow;
}

Assistant:

size_t quantize_q4_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q4_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q4_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q4_K_impl(src, (block_q4_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}